

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O1

bool adios2::utils::introspectAsBPFile(ifstream *f,string *name)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  undefined8 *puVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  char *pcVar10;
  string VersionTag;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar6 = (undefined8 *)operator_new(0x38);
  puVar6[4] = 0;
  puVar6[5] = 0;
  puVar6[2] = 0;
  puVar6[3] = 0;
  *puVar6 = 0;
  puVar6[1] = 0;
  puVar6[6] = 0;
  std::istream::seekg((long)f,_S_beg);
  uVar7 = std::istream::tellg();
  if (0x37 < (long)uVar7) {
    std::istream::seekg((long)f,0xffffffc8);
    std::istream::read((char *)f,(long)puVar6);
    bVar9 = true;
    if (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 5) != 0) goto LAB_00114b27;
    bVar1 = *(byte *)((long)puVar6 + 0x34);
    if (bVar1 < 2) {
      bVar9 = false;
      if ((3 < *(byte *)((long)puVar6 + 0x36)) || (*(byte *)((long)puVar6 + 0x36) == 1))
      goto LAB_00114b27;
      cVar2 = *(char *)((long)puVar6 + 0x37);
      if (0xfc < (byte)(cVar2 - 4U)) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,puVar6,(long)puVar6 + 0x1c);
        if ((bVar1 == 1) ||
           (((*(ulong *)((long)puVar6 + 0x2c) < uVar7 &&
             (*(ulong *)((long)puVar6 + 0x1c) < *(ulong *)((long)puVar6 + 0x24))) &&
            (*(ulong *)((long)puVar6 + 0x24) < *(ulong *)((long)puVar6 + 0x2c))))) {
          if (cVar2 < '\x03') {
            printf("ADIOS-BP Version %d\n",(ulong)(uint)(int)cVar2);
          }
          else {
            bVar3 = *(byte *)(puVar6 + 3);
            bVar4 = *(byte *)((long)puVar6 + 0x1a);
            bVar5 = *(byte *)((long)puVar6 + 0x19) - 0x30;
            if (bVar3 < 0x31) {
              bVar5 = *(byte *)((long)puVar6 + 0x19);
            }
            pcVar8 = local_50[0] + 10;
            do {
              pcVar10 = pcVar8;
              pcVar8 = pcVar10 + 1;
            } while ((byte)(*pcVar10 - 0x30U) < 10 || *pcVar10 == '.');
            if (0x30 < bVar3) {
              bVar4 = bVar4 - 0x30;
              bVar3 = bVar3 - 0x30;
            }
            *pcVar10 = '\0';
            pcVar8 = "Little Endian";
            if (bVar1 == 1) {
              pcVar8 = "Big Endian";
            }
            printf("ADIOS-BP Version %d %s - ADIOS v%d.%d.%d\n",3,pcVar8,(ulong)bVar3,(ulong)bVar5,
                   (ulong)bVar4);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          bVar9 = true;
          goto LAB_00114b27;
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
    }
  }
  bVar9 = false;
LAB_00114b27:
  operator_delete(puVar6);
  return bVar9;
}

Assistant:

bool introspectAsBPFile(std::ifstream &f, const std::string &name) noexcept
{
    const int MFOOTERSIZE = 56;
    std::vector<char> buffer(MFOOTERSIZE, 0);
    f.seekg(0, f.end);
    auto flength = f.tellg();
    if (flength < MFOOTERSIZE)
    {
        return false;
    }
    f.seekg(-MFOOTERSIZE, f.end);
    f.read(buffer.data(), MFOOTERSIZE);
    if (f)
    {
        const uint8_t endianness = static_cast<uint8_t>(buffer[52]);
        if (endianness > 1)
        {
            return false;
        }
        bool IsBigEndian = (endianness == 1) ? true : false;

        const int8_t fileType = static_cast<int8_t>(buffer[54]);
        if (fileType != 0 && fileType != 2 && fileType != 3)
        {
            return false;
        }
        const int8_t BPVersion = static_cast<uint8_t>(buffer[55]);
        if (BPVersion < 1 || BPVersion > 3)
        {
            return false;
        }

        size_t position = 0;
        std::string VersionTag(buffer.data(), 28);
        position = 28;

        if (!IsBigEndian)
        {
            uint64_t PGIndexStart = helper::ReadValue<uint64_t>(buffer, position, !IsBigEndian);
            uint64_t VarsIndexStart = helper::ReadValue<uint64_t>(buffer, position, !IsBigEndian);
            uint64_t AttributesIndexStart =
                helper::ReadValue<uint64_t>(buffer, position, !IsBigEndian);
            if (PGIndexStart >= VarsIndexStart || VarsIndexStart >= AttributesIndexStart ||
                AttributesIndexStart >= static_cast<uint64_t>(flength))
            {
                return false;
            }
        }

        if (BPVersion < 3)
        {
            printf("ADIOS-BP Version %d\n", BPVersion);
        }
        else
        {
            uint8_t major = static_cast<uint8_t>(buffer[24]);
            uint8_t minor = static_cast<uint8_t>(buffer[25]);
            uint8_t patch = static_cast<uint8_t>(buffer[26]);
            if (major > '0')
            {
                // ADIOS2 writes these as ASCII characters
                major -= '0';
                minor -= '0';
                patch -= '0';
            }

            /* Cleanup ADIOS2 bug here: VersionTag is not filled with 0s */
            int pos = 10;
            while (VersionTag[pos] == '.' || (VersionTag[pos] >= '0' && VersionTag[pos] <= '9'))
            {
                ++pos;
            }
            VersionTag[pos] = '\0';
            printf("ADIOS-BP Version %d %s - ADIOS v%d.%d.%d\n", BPVersion,
                   (IsBigEndian ? "Big Endian" : "Little Endian"), major, minor, patch);
        }
    }
    return true;
}